

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_backend_test.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  pointer ptVar2;
  allocator local_189;
  unique_ptr<cppcms::impl::tcp_cache_service,_std::default_delete<cppcms::impl::tcp_cache_service>_>
  srv2;
  unique_ptr<cppcms::impl::tcp_cache_service,_std::default_delete<cppcms::impl::tcp_cache_service>_>
  srv1;
  vector<int,_std::allocator<int>_> ports;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ips;
  intrusive_ptr<cppcms::impl::base_cache> local_138;
  intrusive_ptr<cppcms::impl::base_cache> local_130;
  intrusive_ptr<cppcms::impl::base_cache> local_128;
  intrusive_ptr<cppcms::impl::base_cache> local_120;
  intrusive_ptr<cppcms::impl::base_cache> local_118;
  intrusive_ptr<cppcms::impl::base_cache> local_110;
  intrusive_ptr<cppcms::impl::base_cache> local_108;
  intrusive_ptr<cppcms::impl::base_cache> local_100;
  intrusive_ptr<cppcms::impl::base_cache> local_f8;
  intrusive_ptr<cppcms::impl::base_cache> local_f0;
  intrusive_ptr<cppcms::impl::base_cache> local_e8;
  intrusive_ptr<cppcms::impl::base_cache> local_e0;
  intrusive_ptr<cppcms::impl::base_cache> local_d8;
  intrusive_ptr<cppcms::impl::base_cache> local_d0;
  intrusive_ptr<cppcms::impl::base_cache> local_c8;
  intrusive_ptr<cppcms::impl::base_cache> local_c0;
  intrusive_ptr<cppcms::impl::base_cache> local_b8;
  intrusive_ptr<cppcms::impl::base_cache> local_b0;
  intrusive_ptr<cppcms::impl::base_cache> local_a8;
  intrusive_ptr<cppcms::impl::base_cache> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined8 local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_70;
  undefined8 local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_60 [2];
  string local_50 [32];
  string local_30 [32];
  
  std::operator<<((ostream *)&std::cout,"Testing thread cache... ");
  std::ostream::flush();
  cppcms::impl::thread_cache_factory((uint)&local_c0);
  test_cache(&local_c0,true);
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr(&local_c0);
  poVar1 = std::operator<<((ostream *)&std::cout,"Ok");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"Testing process cache... ");
  std::ostream::flush();
  cppcms::impl::process_cache_factory((ulong)&local_c8,0x1000000);
  test_cache(&local_c8,true);
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr(&local_c8);
  poVar1 = std::operator<<((ostream *)&std::cout,"Ok");
  std::endl<char,std::char_traits<char>>(poVar1);
  srv1._M_t.
  super___uniq_ptr_impl<cppcms::impl::tcp_cache_service,_std::default_delete<cppcms::impl::tcp_cache_service>_>
  ._M_t.
  super__Tuple_impl<0UL,_cppcms::impl::tcp_cache_service_*,_std::default_delete<cppcms::impl::tcp_cache_service>_>
  .super__Head_base<0UL,_cppcms::impl::tcp_cache_service_*,_false>._M_head_impl =
       (__uniq_ptr_data<cppcms::impl::tcp_cache_service,_std::default_delete<cppcms::impl::tcp_cache_service>,_true,_true>
        )(__uniq_ptr_impl<cppcms::impl::tcp_cache_service,_std::default_delete<cppcms::impl::tcp_cache_service>_>
          )0x0;
  srv2._M_t.
  super___uniq_ptr_impl<cppcms::impl::tcp_cache_service,_std::default_delete<cppcms::impl::tcp_cache_service>_>
  ._M_t.
  super__Tuple_impl<0UL,_cppcms::impl::tcp_cache_service_*,_std::default_delete<cppcms::impl::tcp_cache_service>_>
  .super__Head_base<0UL,_cppcms::impl::tcp_cache_service_*,_false>._M_head_impl =
       (__uniq_ptr_data<cppcms::impl::tcp_cache_service,_std::default_delete<cppcms::impl::tcp_cache_service>,_true,_true>
        )(__uniq_ptr_impl<cppcms::impl::tcp_cache_service,_std::default_delete<cppcms::impl::tcp_cache_service>_>
          )0x0;
  std::operator<<((ostream *)&std::cout,"Testing cache over ip, single server... ");
  std::ostream::flush();
  ips.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ips.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ips.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ports.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  ports.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  ports.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_98,"127.0.0.1",&local_189);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&ips,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  local_98._M_dataplus._M_p._0_4_ = 0x1771;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&ports,(int *)&local_98);
  ptVar2 = (pointer)operator_new(8);
  cppcms::impl::thread_cache_factory((uint)&local_d0);
  local_68 = 0;
  a_Stack_60[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string(local_30,"127.0.0.1",(allocator *)&local_98);
  cppcms::impl::tcp_cache_service::tcp_cache_service
            (ptVar2,&local_d0,&local_68,1,local_30,0x1771,10);
  std::
  __uniq_ptr_impl<cppcms::impl::tcp_cache_service,_std::default_delete<cppcms::impl::tcp_cache_service>_>
  ::reset((__uniq_ptr_impl<cppcms::impl::tcp_cache_service,_std::default_delete<cppcms::impl::tcp_cache_service>_>
           *)&srv1,ptVar2);
  std::__cxx11::string::~string(local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_60);
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr(&local_d0);
  local_a0.p_ = (base_cache *)0x0;
  cppcms::impl::tcp_cache_factory(&local_d8,&ips,&ports);
  test_cache(&local_d8,false);
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr(&local_d8);
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr(&local_a0);
  poVar1 = std::operator<<((ostream *)&std::cout,"Ok");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"Testing cache over ip, single server with L1 cache... ");
  std::ostream::flush();
  cppcms::impl::thread_cache_factory((uint)&local_e8);
  cppcms::impl::tcp_cache_factory(&local_e0,&ips,&ports,&local_e8);
  test_cache(&local_e0,false);
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr(&local_e0);
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr(&local_e8);
  poVar1 = std::operator<<((ostream *)&std::cout,"Ok");
  std::endl<char,std::char_traits<char>>(poVar1);
  ptVar2 = (pointer)operator_new(8);
  cppcms::impl::thread_cache_factory((uint)&local_f0);
  local_78 = 0;
  _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string(local_50,"127.0.0.1",(allocator *)&local_98);
  cppcms::impl::tcp_cache_service::tcp_cache_service
            (ptVar2,&local_f0,&local_78,1,local_50,0x1772,10);
  std::
  __uniq_ptr_impl<cppcms::impl::tcp_cache_service,_std::default_delete<cppcms::impl::tcp_cache_service>_>
  ::reset((__uniq_ptr_impl<cppcms::impl::tcp_cache_service,_std::default_delete<cppcms::impl::tcp_cache_service>_>
           *)&srv2,ptVar2);
  std::__cxx11::string::~string(local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_70);
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr(&local_f0);
  std::__cxx11::string::string((string *)&local_98,"127.0.0.1",&local_189);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&ips,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  local_98._M_dataplus._M_p._0_4_ = 0x1772;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&ports,(int *)&local_98);
  std::operator<<((ostream *)&std::cout,"Testing cache over ip, multiple server... ");
  std::ostream::flush();
  local_a8.p_ = (base_cache *)0x0;
  cppcms::impl::tcp_cache_factory(&local_f8,&ips,&ports);
  test_cache(&local_f8,false);
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr(&local_f8);
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr(&local_a8);
  poVar1 = std::operator<<((ostream *)&std::cout,"Ok");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"Testing cache over ip, multiple server with L1 cache... ");
  std::ostream::flush();
  cppcms::impl::thread_cache_factory((uint)&local_108);
  cppcms::impl::tcp_cache_factory(&local_100,&ips,&ports,&local_108);
  test_cache(&local_100,false);
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr(&local_100);
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr(&local_108);
  poVar1 = std::operator<<((ostream *)&std::cout,"Ok");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(&ips,1);
  std::vector<int,_std::allocator<int>_>::resize(&ports,1);
  std::operator<<((ostream *)&std::cout,"Testing two clients... ");
  std::ostream::flush();
  cppcms::impl::thread_cache_factory((uint)&local_118);
  cppcms::impl::tcp_cache_factory(&local_110,&ips,&ports,&local_118);
  cppcms::impl::thread_cache_factory((uint)&local_128);
  cppcms::impl::tcp_cache_factory(&local_120,&ips,&ports,&local_128);
  test_two_clients(&local_110,&local_120);
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr(&local_120);
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr(&local_128);
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr(&local_110);
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr(&local_118);
  poVar1 = std::operator<<((ostream *)&std::cout,"Ok");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"Testing two clients with L1 cache... ");
  std::ostream::flush();
  local_b0.p_ = (base_cache *)0x0;
  cppcms::impl::tcp_cache_factory(&local_130,&ips,&ports);
  local_b8.p_ = (base_cache *)0x0;
  cppcms::impl::tcp_cache_factory(&local_138,&ips,&ports);
  test_two_clients(&local_130,&local_138);
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr(&local_138);
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr(&local_b8);
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr(&local_130);
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr(&local_b0);
  poVar1 = std::operator<<((ostream *)&std::cout,"Ok");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&ports.super__Vector_base<int,_std::allocator<int>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&ips);
  cppcms::impl::tcp_cache_service::stop();
  cppcms::impl::tcp_cache_service::stop();
  std::
  unique_ptr<cppcms::impl::tcp_cache_service,_std::default_delete<cppcms::impl::tcp_cache_service>_>
  ::~unique_ptr(&srv2);
  std::
  unique_ptr<cppcms::impl::tcp_cache_service,_std::default_delete<cppcms::impl::tcp_cache_service>_>
  ::~unique_ptr(&srv1);
  return 0;
}

Assistant:

int main()
{
	typedef booster::shared_ptr<cppcms::sessions::session_storage_factory> sfact_type;
	try {
		std::cout << "Testing thread cache... "<< std::flush;
		test_cache(cppcms::impl::thread_cache_factory(20));
		std::cout << "Ok" << std::endl;
		#if !defined(CPPCMS_WIN32) && !defined(CPPCMS_NO_PREFOK_CACHE)
		std::cout << "Testing process cache... " << std::flush;
		test_cache(cppcms::impl::process_cache_factory(16*1024*1024,20));
		std::cout << "Ok" << std::endl;
		#endif
		
		std::unique_ptr<cppcms::impl::tcp_cache_service> srv1,srv2;
		{
			try {
				std::cout << "Testing cache over ip, single server... "<<std::flush;
				std::vector<std::string> ips;
				std::vector<int> ports;
				ips.push_back("127.0.0.1");
				ports.push_back(6001);
				srv1.reset(new cppcms::impl::tcp_cache_service(
							cppcms::impl::thread_cache_factory(20),
							sfact_type(),
							1,"127.0.0.1",6001));

				test_cache(cppcms::impl::tcp_cache_factory(ips,ports,0),false);
				std::cout << "Ok" << std::endl;
				std::cout << "Testing cache over ip, single server with L1 cache... "<<std::flush;
				test_cache(cppcms::impl::tcp_cache_factory(ips,ports,cppcms::impl::thread_cache_factory(5)),false);
				std::cout << "Ok" << std::endl;
				srv2.reset(new cppcms::impl::tcp_cache_service(
						cppcms::impl::thread_cache_factory(20),
						sfact_type(),
						1,"127.0.0.1",6002));
				ips.push_back("127.0.0.1");
				ports.push_back(6002);
				std::cout << "Testing cache over ip, multiple server... "<<std::flush;
				test_cache(cppcms::impl::tcp_cache_factory(ips,ports,0),false);
				std::cout << "Ok" << std::endl;
				std::cout << "Testing cache over ip, multiple server with L1 cache... "<<std::flush;
				test_cache(cppcms::impl::tcp_cache_factory(ips,ports,cppcms::impl::thread_cache_factory(5)),false);
				std::cout << "Ok" <<std::endl;
				ips.resize(1);
				ports.resize(1);
				std::cout << "Testing two clients... "<<std::flush;
				test_two_clients(
					cppcms::impl::tcp_cache_factory(ips,ports,cppcms::impl::thread_cache_factory(5)),
					cppcms::impl::tcp_cache_factory(ips,ports,cppcms::impl::thread_cache_factory(5)));
				std::cout << "Ok" <<std::endl;
				std::cout << "Testing two clients with L1 cache... "<<std::flush;
				test_two_clients(
					cppcms::impl::tcp_cache_factory(ips,ports,0),
					cppcms::impl::tcp_cache_factory(ips,ports,0));
				std::cout << "Ok" <<std::endl;
					
			}
			catch(...) {
				if(srv1.get()) {
					srv1->stop();
					srv1.reset();
				}
				if(srv2.get()) {
					srv2->stop();
					srv2.reset();
				}
				throw;
			}
			srv1->stop();	
			srv2->stop();
			
		}

	}
	catch(std::exception const &e) {
		std::cerr << "\nFail " << e.what() << std::endl;
		return 1;
	}
	return 0;

}